

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *pRVar1;
  uint *puVar2;
  long lVar3;
  undefined8 uVar4;
  FieldDescriptor FVar5;
  uint uVar6;
  OneofDescriptor *oneof_descriptor;
  long lVar7;
  string *default_value;
  byte bVar8;
  bool bVar9;
  uint32 uVar10;
  ulong uVar11;
  EnumValueDescriptor *pEVar12;
  undefined8 *puVar13;
  long lVar14;
  Arena *arena;
  long *plVar15;
  undefined4 uVar16;
  long lVar17;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_38 = FieldDescriptor::TypeOnceInit;
      local_40 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_38,&local_40);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = 0;
      return;
    case 9:
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar11 = (ulong)uVar10;
      lVar14 = (long)*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar11);
      if (lVar14 < 1) {
        return;
      }
      lVar7 = *(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + uVar11);
      lVar17 = 0;
      do {
        puVar13 = *(undefined8 **)(lVar7 + 8 + lVar17 * 8);
        lVar17 = lVar17 + 1;
        puVar13[1] = 0;
        *(undefined1 *)*puVar13 = 0;
      } while (lVar14 != lVar17);
      *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar11) = 0;
      return;
    case 10:
      goto switchD_0027e8f3_caseD_a;
    default:
      return;
    }
  }
  oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
  if (oneof_descriptor != (OneofDescriptor *)0x0) {
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44)) {
      return;
    }
    ClearOneof(this,message,oneof_descriptor);
    return;
  }
  bVar9 = HasBit(this,message,field);
  if (!bVar9) {
    return;
  }
  uVar11 = (ulong)(uint)(this->schema_).has_bits_offset_;
  if (uVar11 != 0xffffffff) {
    if (field[0x42] == (FieldDescriptor)0x0) {
      plVar15 = (long *)(*(long *)(field + 0x50) + 0x28);
    }
    else if (*(long *)(field + 0x60) == 0) {
      plVar15 = (long *)(*(long *)(field + 0x28) + 0x80);
    }
    else {
      plVar15 = (long *)(*(long *)(field + 0x60) + 0x50);
    }
    uVar6 = (this->schema_).has_bit_indices_
            [(int)((ulong)((long)field - *plVar15) >> 3) * 0x286bca1b];
    bVar8 = (byte)uVar6 & 0x1f;
    puVar2 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar6 >> 5) * 4 + uVar11);
    *puVar2 = *puVar2 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_40);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
  case 3:
    uVar16 = *(undefined4 *)(field + 0x90);
    goto LAB_0027eb70;
  case 2:
  case 4:
    uVar4 = *(undefined8 *)(field + 0x90);
    uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = uVar4;
    break;
  case 5:
    uVar4 = *(undefined8 *)(field + 0x90);
    uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = uVar4;
    break;
  case 6:
    uVar16 = *(undefined4 *)(field + 0x90);
    uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = uVar16;
    break;
  case 7:
    FVar5 = field[0x90];
    uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(FieldDescriptor *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
         FVar5;
    break;
  case 8:
    pEVar12 = FieldDescriptor::default_value_enum(field);
    uVar16 = *(undefined4 *)(pEVar12 + 0x10);
LAB_0027eb70:
    uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = uVar16;
    break;
  case 9:
    pRVar1 = &this->schema_;
    bVar9 = internal::ReflectionSchema::IsFieldInlined(pRVar1,field);
    if (bVar9) {
      internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      std::__cxx11::string::_M_assign
                ((string *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
    }
    else {
      puVar13 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
      default_value = (string *)*puVar13;
      uVar10 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      arena = *(Arena **)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).metadata_offset_);
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      internal::ArenaStringPtr::SetAllocated
                ((ArenaStringPtr *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10),
                 default_value,(string *)0x0,arena);
    }
    break;
  case 10:
    pRVar1 = &this->schema_;
    if ((this->schema_).has_bits_offset_ == -1) {
      uVar11 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar11 & 1) != 0) {
        uVar11 = *(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x18);
      }
      if (uVar11 == 0) {
        uVar10 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
        plVar15 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
        if (plVar15 != (long *)0x0) {
          (**(code **)(*plVar15 + 8))();
        }
      }
      uVar10 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) = 0;
    }
    else {
      uVar10 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10
                              ) + 0x38))();
    }
  }
  return;
switchD_0027e8f3_caseD_a:
  bVar9 = anon_unknown_0::IsMapFieldInApi(field);
  uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  plVar15 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
  if (bVar9) {
    (**(code **)(*plVar15 + 0x58))(plVar15);
    return;
  }
  lVar14 = plVar15[1];
  if ((long)(int)lVar14 < 1) {
    return;
  }
  lVar7 = plVar15[2];
  lVar17 = 0;
  do {
    lVar3 = lVar17 * 8;
    lVar17 = lVar17 + 1;
    (**(code **)(**(long **)(lVar7 + 8 + lVar3) + 0x38))();
  } while ((int)lVar14 != lVar17);
  *(undefined4 *)(plVar15 + 1) = 0;
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32);
        CLEAR_TYPE(INT64, int64);
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* default_ptr =
                    &DefaultRaw<InlinedStringField>(field).GetNoArena();
                MutableRaw<InlinedStringField>(message, field)
                    ->SetNoArena(default_ptr, *default_ptr);
                break;
              }

              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)
                  ->SetAllocated(default_ptr, nullptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to nullptr in order to indicate its un-presence.
            if (GetArena(message) == nullptr) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = nullptr;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}